

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_tools_visuals.cxx
# Opt level: O1

void __thiscall level_tools::calculate_ext_meshes(level_tools *this,size_t *vb_size,size_t *ib_size)

{
  xr_level_spawn *pxVar1;
  pointer ppcVar2;
  cse_abstract *pcVar3;
  xr_ogf *pxVar4;
  pointer ppxVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar7;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  pointer ppcVar8;
  pointer ppxVar9;
  pointer ppxVar10;
  
  pxVar1 = this->m_level->m_spawn;
  if (pxVar1 != (xr_level_spawn *)0x0) {
    ppcVar8 = (pxVar1->m_spawns).
              super__Vector_base<xray_re::cse_abstract_*,_std::allocator<xray_re::cse_abstract_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppcVar2 = (pxVar1->m_spawns).
              super__Vector_base<xray_re::cse_abstract_*,_std::allocator<xray_re::cse_abstract_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (ppcVar8 != ppcVar2) {
      ppxVar9 = (this->m_level->m_brkbl_meshes).
                super__Vector_base<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        pcVar3 = *ppcVar8;
        iVar6 = std::__cxx11::string::compare((char *)&pcVar3->m_s_name);
        if (iVar6 == 0) {
          *vb_size = *vb_size + 4;
          lVar7 = 6;
LAB_00138d81:
          *ib_size = *ib_size + lVar7;
        }
        else {
          iVar6 = std::__cxx11::string::compare((char *)&pcVar3->m_s_name);
          if (iVar6 == 0) {
            pxVar4 = *ppxVar9;
            ppxVar9 = ppxVar9 + 1;
            iVar6 = (*(pxVar4->super_xr_object).super_xr_surface_factory._vptr_xr_surface_factory
                      [0x16])(pxVar4);
            if ((char)iVar6 == '\0') {
              iVar6 = (*(pxVar4->super_xr_object).super_xr_surface_factory._vptr_xr_surface_factory
                        [0x1f])(pxVar4);
              *vb_size = *vb_size + *(long *)(CONCAT44(extraout_var_01,iVar6) + 0x10);
              iVar6 = (*(pxVar4->super_xr_object).super_xr_surface_factory._vptr_xr_surface_factory
                        [0x20])(pxVar4);
              lVar7 = *(long *)(CONCAT44(extraout_var_02,iVar6) + 0x10);
              goto LAB_00138d81;
            }
            ppxVar5 = (pxVar4->m_children).
                      super__Vector_base<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            for (ppxVar10 = (pxVar4->m_children).
                            super__Vector_base<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>
                            ._M_impl.super__Vector_impl_data._M_start; ppxVar10 != ppxVar5;
                ppxVar10 = ppxVar10 + 1) {
              pxVar4 = *ppxVar10;
              iVar6 = (*(pxVar4->super_xr_object).super_xr_surface_factory._vptr_xr_surface_factory
                        [0x1f])(pxVar4);
              *vb_size = *vb_size + *(long *)(CONCAT44(extraout_var,iVar6) + 0x10);
              iVar6 = (*(pxVar4->super_xr_object).super_xr_surface_factory._vptr_xr_surface_factory
                        [0x20])(pxVar4);
              *ib_size = *ib_size + *(long *)(CONCAT44(extraout_var_00,iVar6) + 0x10);
            }
          }
        }
        ppcVar8 = ppcVar8 + 1;
      } while (ppcVar8 != ppcVar2);
    }
  }
  return;
}

Assistant:

void level_tools::calculate_ext_meshes(size_t& vb_size, size_t& ib_size) const
{
	if (m_level->spawn() == 0)
		return;
	xr_ogf_vec_cit brkbl_it = m_level->brkbl_meshes().begin();
	const xr_entity_vec& spawns = m_level->spawn()->spawns();
	for (xr_entity_vec_cit it = spawns.begin(), end = spawns.end(); it != end; ++it) {
		const cse_abstract* entity = *it;
		if (entity->name() == "climable_object") {
			vb_size += 4;
			ib_size += 6;
		} else if (entity->name() == "breakable_object") {
			const xr_ogf* ogf = *brkbl_it++;
			if (ogf->hierarchical()) {
				for (xr_ogf_vec_cit it1 = ogf->children().begin(),
						end1 = ogf->children().end(); it1 != end1; ++it1) {
					const xr_ogf* ogf1 = *it1;
					vb_size += ogf1->vb().size();
					ib_size += ogf1->ib().size();
				}
			} else {
				vb_size += ogf->vb().size();
				ib_size += ogf->ib().size();
			}
		}
	}
}